

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

vector<Pathie::Path,_std::allocator<Pathie::Path>_> *
Pathie::Path::get_xdg_dirlist
          (vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,
          string *envvarname,string *defaultlist)

{
  char *pcVar1;
  long lVar2;
  allocator local_f9;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> *local_f8;
  string local_f0;
  string envstr;
  string local_b0;
  string local_90;
  string env_nstr;
  string local_50;
  
  local_f8 = __return_storage_ptr__;
  utf8_to_filename(&env_nstr,envvarname);
  pcVar1 = getenv(env_nstr._M_dataplus._M_p);
  envstr._M_dataplus._M_p = (pointer)&envstr.field_2;
  envstr._M_string_length = 0;
  envstr.field_2._M_local_buf[0] = '\0';
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    std::__cxx11::string::_M_assign((string *)&envstr);
  }
  else {
    std::__cxx11::string::string((string *)&local_90,pcVar1,&local_f9);
    filename_to_utf8(&local_f0,&local_90);
    std::__cxx11::string::_M_assign((string *)&envstr);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  (local_f8->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_f8->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_f8->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    lVar2 = std::__cxx11::string::find((char *)&envstr,0x10f1a8);
    if (lVar2 == -1) break;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&envstr);
    Path((Path *)&local_f0,&local_50);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (local_f8,(value_type *)&local_f0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)&envstr);
  Path((Path *)&local_f0,&local_b0);
  std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
            (local_f8,(value_type *)&local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return local_f8;
}

Assistant:

std::vector<Path> Path::get_xdg_dirlist(const std::string& envvarname, const std::string& defaultlist)
{
  std::string env_nstr = utf8_to_filename(envvarname); // environment is encoded the same as the filenames
  char* env_value = getenv(env_nstr.c_str());
  std::string envstr;
  if (env_value && strcmp(env_value, "") != 0)
    envstr = filename_to_utf8(env_value); // Encode entire env string to UTF-8
  else
    envstr = defaultlist;

  size_t pos = 0;
  size_t lastpos = 0;
  std::vector<Path> results;
  while ((pos = envstr.find(":")) != string::npos) {
    results.push_back(Path(envstr.substr(lastpos, pos))); // envstr is already UTF-8

    lastpos = pos + 1;
    pos++;
  }

  results.push_back(envstr.substr(lastpos));

  return results;
}